

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<TestResult_(mp::CallExpr)>::FunctionMockerBase
          (FunctionMockerBase<TestResult_(mp::CallExpr)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<TestResult_(mp::CallExpr)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0029fae0;
  MockSpec<TestResult_(mp::CallExpr)>::MockSpec
            ((MockSpec<TestResult_(mp::CallExpr)> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}